

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colList.c
# Opt level: O0

void MListInsert(Col_Word *nodePtr,size_t index,Col_Word list)

{
  byte bVar1;
  size_t sVar2;
  size_t max;
  Col_Word CVar3;
  uint local_8c;
  uint local_88;
  uint local_84;
  Col_Word node;
  MergeListChunksInfo info_1;
  MergeListChunksInfo info;
  Col_Word *elements;
  size_t maxLength;
  Col_Word left;
  size_t leftLength;
  int type;
  size_t listLength;
  size_t length;
  Col_Word list_local;
  size_t index_local;
  Col_Word *nodePtr_local;
  
  sVar2 = Col_ListLength(*nodePtr);
  max = Col_ListLength(list);
  if (sVar2 == 0) {
    CVar3 = Col_CopyMList(list);
    *nodePtr = CVar3;
    return;
  }
  do {
    while( true ) {
      if (*nodePtr == 0) {
        local_84 = 0;
      }
      else {
        if ((*nodePtr & 0xf) == 0) {
          if ((*(byte *)*nodePtr & 2) == 0) {
            local_8c = 0xffffffff;
          }
          else {
            local_8c = *(byte *)*nodePtr & 0xfffffffe;
          }
          local_88 = local_8c;
        }
        else {
          local_88 = immediateWordTypes[*nodePtr & 0x1f];
        }
        local_84 = local_88;
      }
      if (local_84 == 0x1a) {
        CVar3 = *nodePtr;
        if (max <= ((*(ulong *)*nodePtr >> 8) * 0x20 - 0x10 >> 3) - sVar2) {
          Col_MVectorSetLength(*nodePtr,sVar2 + max);
          memmove((void *)(CVar3 + 0x10 + index * 8 + max * 8),(void *)(CVar3 + 0x10 + index * 8),
                  (sVar2 - index) * 8);
          info_1.vector = index;
          Col_TraverseListChunks(list,0,max,0,MergeListChunksProc,&info_1.vector,(size_t *)0x0);
          return;
        }
      }
      else if (local_84 == 0x26) {
        left = (Col_Word)*(ushort *)(*nodePtr + 2);
        CVar3 = *(Col_Word *)(*nodePtr + 0x10);
        if (left == 0) {
          left = Col_ListLength(CVar3);
        }
        if (((index == left) && (1 < *(byte *)(*nodePtr + 1))) &&
           (bVar1 = GetDepth(CVar3), (int)(uint)bVar1 < (int)(*(byte *)(*nodePtr + 1) - 1))) {
          MListInsert((Col_Word *)(*nodePtr + 0x10),index,list);
          UpdateMConcatNode(*nodePtr);
          return;
        }
        if (left < index) {
          MListInsert((Col_Word *)(*nodePtr + 0x18),index - left,list);
        }
        else {
          MListInsert((Col_Word *)(*nodePtr + 0x10),index,list);
        }
        UpdateMConcatNode(*nodePtr);
        return;
      }
      if (sVar2 + max < 0x27) {
        CVar3 = Col_NewMVector(0,sVar2 + max,(Col_Word *)0x0);
        node = 0;
        info_1.length = CVar3;
        Col_TraverseListChunks(*nodePtr,0,index,0,MergeListChunksProc,&node,(size_t *)0x0);
        Col_TraverseListChunks(list,0,max,0,MergeListChunksProc,&node,(size_t *)0x0);
        Col_TraverseListChunks
                  (*nodePtr,index,sVar2 - index,0,MergeListChunksProc,&node,(size_t *)0x0);
        *nodePtr = CVar3;
        return;
      }
      if (local_84 == 0x1e) break;
      if (local_84 == 0x22) {
        ConvertToMConcatNode(nodePtr);
      }
      else {
LAB_0011b6b5:
        if ((index == 0) || (sVar2 <= index)) {
          CVar3 = Col_CopyMList(list);
          if (index == 0) {
            CVar3 = NewMConcatList(CVar3,*nodePtr);
            *nodePtr = CVar3;
          }
          else {
            CVar3 = NewMConcatList(*nodePtr,CVar3);
            *nodePtr = CVar3;
          }
          UpdateMConcatNode(*nodePtr);
          return;
        }
        SplitMutableAt(nodePtr,index);
      }
    }
    if (*(char *)(*nodePtr + 1) == '\0') goto LAB_0011b6b5;
    ConvertToMConcatNode(nodePtr);
  } while( true );
}

Assistant:

static void
MListInsert(
    Col_Word * nodePtr, /*!< [in,out] Mutable list node to insert into. May be
                             overwritten in the process (e.g. if it gets
                             converted to mutable). */
    size_t index,       /*!< Index of insertion point. */
    Col_Word list)      /*!< List to insert. */
{
    size_t length = Col_ListLength(*nodePtr);
    size_t listLength = Col_ListLength(list);
    int type;

    ASSERT(index <= length);
    ASSERT(SIZE_MAX-length >= listLength);
    ASSERT(listLength > 0);

    if (length == 0) {
        /*
         * Replace content.
         */

        *nodePtr = Col_CopyMList(list);
        return;
    }

    /*
     * Entry point for tail recursive calls.
     */

start:

    /*
     * First try to alter mutable types if possible.
     */

    type = WORD_TYPE(*nodePtr);
    switch (type) {
    case WORD_TYPE_MCONCATLIST: {
        size_t leftLength = WORD_CONCATLIST_LEFT_LENGTH(*nodePtr);
        Col_Word left = WORD_CONCATLIST_LEFT(*nodePtr);
        if (leftLength == 0) {
            leftLength = Col_ListLength(left);
        }

        if (index == leftLength && WORD_CONCATLIST_DEPTH(*nodePtr) > 1) {
            /*
             * Insertion point is just between the two arms. Insert into
             * the shallowest one to balance tree.
             */

            if (GetDepth(left) < WORD_CONCATLIST_DEPTH(*nodePtr)-1) {
                /*
                 * Right is deeper, insert into left.
                 */

                MListInsert(&WORD_CONCATLIST_LEFT(*nodePtr), index,
                        list);
                UpdateMConcatNode(*nodePtr);
                return;
            }
        }

        if (index <= leftLength) {
            /*
             * Insert into left.
             */

            MListInsert(&WORD_CONCATLIST_LEFT(*nodePtr), index, list);
        } else {
            /*
             * Insert into right.
             */

            MListInsert(&WORD_CONCATLIST_RIGHT(*nodePtr),
                    index-leftLength, list);
        }
        UpdateMConcatNode(*nodePtr);
        return;
        }

    case WORD_TYPE_MVECTOR: {
        size_t maxLength = VECTOR_MAX_LENGTH(WORD_MVECTOR_SIZE(*nodePtr)
                * CELL_SIZE);
        Col_Word *elements = WORD_VECTOR_ELEMENTS(*nodePtr);
        if (listLength <= maxLength-length) {
            /*
             * Insert data directly into available space.
             */

            MergeListChunksInfo info;

            Col_MVectorSetLength(*nodePtr, length+listLength);

            /*
             * Move trailing elements.
             */

            memmove(elements+index+listLength, elements+index,
                    (length-index) * sizeof(*elements));

            /*
             * Copy elements from list.
             */

            info.length = index;
            info.vector = *nodePtr;
            Col_TraverseListChunks(list, 0, listLength, 0, MergeListChunksProc,
                    &info, NULL);
            ASSERT(info.length == index+listLength);
            return;
        }

        /*
         * Try other methods below.
         */

        break;
        }

    }

    if (length+listLength <= MAX_SHORT_MVECTOR_LENGTH) {
        /*
         * Merge all chunks into one mutable vector for short lists.
         * TODO: geometric growth?
         */

        MergeListChunksInfo info;

        Col_Word node = Col_NewMVector(0, length+listLength, NULL);

        info.length = 0;
        info.vector = node;
        Col_TraverseListChunks(*nodePtr, 0, index, 0, MergeListChunksProc,
                &info, NULL);
        Col_TraverseListChunks(list, 0, listLength, 0, MergeListChunksProc,
                &info, NULL);
        Col_TraverseListChunks(*nodePtr, index, length-index, 0,
                MergeListChunksProc, &info, NULL);
        ASSERT(info.length == length+listLength);

        *nodePtr = node;
        return;
    }

    /*
     * General case with immutable types and mutable with no available space.
     */

    switch (type) {
    case WORD_TYPE_CONCATLIST:
        /*
         * Convert to mutable concat then retry.
         */

        ConvertToMConcatNode(nodePtr);
        goto start;

    case WORD_TYPE_SUBLIST:
        if (WORD_SUBLIST_DEPTH(*nodePtr) >= 1) {
            /*
             * Source is concat. Convert to mutable concat then retry.
             */

            ConvertToMConcatNode(nodePtr);
            goto start;
        }
        /* continued. */
    default:
        if (index > 0 && index < length) {
            /*
             * Split at insertion point then retry.
             */

            SplitMutableAt(nodePtr, index);
            goto start;
        }

        /*
         * Build a mutable concat node with current node and list to insert.
         */

        list = Col_CopyMList(list);
        if (index == 0) {
            /*
             * Insert before.
             */

            *nodePtr = NewMConcatList(list, *nodePtr);
        } else {
            /*
             * Insert after.
             */

            ASSERT(index >= length);
            *nodePtr = NewMConcatList(*nodePtr, list);
        }
        UpdateMConcatNode(*nodePtr);
        return;
    }
}